

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaBlockMetadata_TLSF::Clear(VmaBlockMetadata_TLSF *this)

{
  VkDeviceSize VVar1;
  Block *in_RDI;
  VmaPoolAllocator<VmaBlockMetadata_TLSF::Block> *unaff_retaddr;
  Block *prev;
  Block *block;
  Block *local_10;
  Block *ptr;
  
  (in_RDI->field_5).nextFree = (Block *)0x0;
  in_RDI[1].offset = 0;
  in_RDI[1].size = 0;
  *(undefined4 *)&in_RDI[1].prevPhysical = 0;
  (in_RDI[7].prevFree)->offset = 0;
  ptr = in_RDI;
  VVar1 = VmaBlockMetadata::GetSize((VmaBlockMetadata *)in_RDI);
  (in_RDI[7].prevFree)->size = VVar1;
  local_10 = (in_RDI[7].prevFree)->prevPhysical;
  (in_RDI[7].prevFree)->prevPhysical = (Block *)0x0;
  while (local_10 != (Block *)0x0) {
    local_10 = local_10->prevPhysical;
    VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Free(unaff_retaddr,ptr);
  }
  memset(in_RDI[6].nextPhysical,0,(ulong)*(uint *)&in_RDI[6].prevPhysical << 3);
  memset(&in_RDI[1].nextPhysical,0,(ulong)*(byte *)((long)&in_RDI[1].prevPhysical + 4) << 2);
  VmaBlockBufferImageGranularity::Clear((VmaBlockBufferImageGranularity *)in_RDI);
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::Clear()
{
    m_AllocCount = 0;
    m_BlocksFreeCount = 0;
    m_BlocksFreeSize = 0;
    m_IsFreeBitmap = 0;
    m_NullBlock->offset = 0;
    m_NullBlock->size = GetSize();
    Block* block = m_NullBlock->prevPhysical;
    m_NullBlock->prevPhysical = VMA_NULL;
    while (block)
    {
        Block* prev = block->prevPhysical;
        m_BlockAllocator.Free(block);
        block = prev;
    }
    memset(m_FreeList, 0, m_ListsCount * sizeof(Block*));
    memset(m_InnerIsFreeBitmap, 0, m_MemoryClasses * sizeof(uint32_t));
    m_GranularityHandler.Clear();
}